

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_kotlin.cpp
# Opt level: O0

string * __thiscall
flatbuffers::kotlin::KotlinGenerator::GenMethod_abi_cxx11_
          (string *__return_storage_ptr__,KotlinGenerator *this,Type *type)

{
  bool bVar1;
  bool bVar2;
  Type *type_00;
  char *local_48;
  allocator<char> local_19;
  KotlinGenerator *local_18;
  Type *type_local;
  
  local_18 = this;
  type_local = (Type *)__return_storage_ptr__;
  bVar1 = IsScalar(*(BaseType *)&(this->super_BaseGenerator)._vptr_BaseGenerator);
  bVar2 = false;
  if (bVar1) {
    ToSignedType_abi_cxx11_(__return_storage_ptr__,local_18,type_00);
  }
  else {
    bVar2 = IsStruct((Type *)local_18);
    if (bVar2) {
      local_48 = "Struct";
    }
    else {
      local_48 = "Offset";
    }
    std::allocator<char>::allocator();
    bVar2 = true;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,local_48,&local_19);
  }
  if (bVar2) {
    std::allocator<char>::~allocator(&local_19);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string GenMethod(const Type &type) {
    return IsScalar(type.base_type) ? ToSignedType(type)
                                    : (IsStruct(type) ? "Struct" : "Offset");
  }